

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall SGParser::Generator::RegExprNFAParseElement::Destroy(RegExprNFAParseElement *this)

{
  NFA *this_00;
  ulong uStack_20;
  
  if (this->DataType == Vector) {
    this_00 = (this->field_1).pNFA;
    if (this_00 != (NFA *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    }
    uStack_20 = 0x18;
  }
  else {
    if (this->DataType != NFA) goto LAB_001348f0;
    this_00 = (this->field_1).pNFA;
    if (this_00 != (NFA *)0x0) {
      NFA::~NFA(this_00);
    }
    uStack_20 = 0x28;
  }
  operator_delete(this_00,uStack_20);
LAB_001348f0:
  this->DataType = Null;
  return;
}

Assistant:

void Destroy() {
        switch (DataType) {
            case RegExprDataType::Null:                break;
            case RegExprDataType::NFA:    delete pNFA; break;
            case RegExprDataType::Vector: delete pVec; break;
            case RegExprDataType::Char:                break;
        }
        DataType = RegExprDataType::Null;
    }